

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwapFields
          (Reflection *this,Message *lhs,Message *rhs,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  string *psVar1;
  void *pvVar2;
  void *pvVar3;
  
  pvVar3 = (void *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    pvVar3 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  pvVar2 = (void *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    pvVar2 = *(void **)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  if (pvVar3 == pvVar2) {
    psVar1 = (string *)0x0;
  }
  else {
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (pvVar3,pvVar2,"lhs->GetArena() == rhs->GetArena()");
  }
  if (psVar1 == (string *)0x0) {
    UnsafeShallowSwapFields(this,lhs,rhs,fields);
    return;
  }
  UnsafeArenaSwapFields();
}

Assistant:

void Reflection::UnsafeArenaSwapFields(
    Message* lhs, Message* rhs,
    const std::vector<const FieldDescriptor*>& fields) const {
  ABSL_DCHECK_EQ(lhs->GetArena(), rhs->GetArena());
  UnsafeShallowSwapFields(lhs, rhs, fields);
}